

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O0

int CBCEncrypt<AES256Encrypt>(AES256Encrypt *enc,uchar *iv,uchar *data,int size,bool pad,uchar *out)

{
  int in_ECX;
  int iVar1;
  byte *in_RDX;
  undefined8 *in_RSI;
  byte in_R8B;
  long in_R9;
  long in_FS_OFFSET;
  int i_2;
  int i_1;
  int i;
  int padsize;
  int written;
  uchar mixed [16];
  uchar *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar2;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar3;
  int in_stack_ffffffffffffffac;
  int local_4c;
  byte *local_38;
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 0;
  iVar1 = in_ECX % 0x10;
  if (((in_RDX == (byte *)0x0) || (in_ECX == 0)) || (in_R9 == 0)) {
    local_1c = 0;
  }
  else if (((in_R8B & 1) == 0) && (iVar1 != 0)) {
    local_1c = 0;
  }
  else {
    local_18 = *in_RSI;
    local_10 = in_RSI[1];
    local_38 = in_RDX;
    for (; local_4c + 0x10 <= in_ECX; local_4c = local_4c + 0x10) {
      for (in_stack_ffffffffffffffac = 0; in_stack_ffffffffffffffac != 0x10;
          in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
        *(byte *)((long)&local_18 + (long)in_stack_ffffffffffffffac) =
             *(byte *)((long)&local_18 + (long)in_stack_ffffffffffffffac) ^ *local_38;
        local_38 = local_38 + 1;
      }
      AES256Encrypt::Encrypt
                ((AES256Encrypt *)CONCAT44(0x10,in_stack_ffffffffffffffa8),
                 (uchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      local_18 = *(undefined8 *)(in_R9 + local_4c);
      local_10 = *(undefined8 *)(in_R9 + 8 + (long)local_4c);
    }
    if ((in_R8B & 1) != 0) {
      for (iVar3 = 0; iVar2 = iVar1, iVar3 != iVar1; iVar3 = iVar3 + 1) {
        *(byte *)((long)&local_18 + (long)iVar3) =
             *(byte *)((long)&local_18 + (long)iVar3) ^ *local_38;
        local_38 = local_38 + 1;
      }
      for (; iVar2 != 0x10; iVar2 = iVar2 + 1) {
        *(byte *)((long)&local_18 + (long)iVar2) =
             *(byte *)((long)&local_18 + (long)iVar2) ^ 0x10U - (char)iVar1;
      }
      AES256Encrypt::Encrypt
                ((AES256Encrypt *)CONCAT44(in_stack_ffffffffffffffac,iVar3),
                 (uchar *)CONCAT44(0x10,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
      local_4c = local_4c + 0x10;
    }
    local_1c = local_4c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

static int CBCEncrypt(const T& enc, const unsigned char iv[AES_BLOCKSIZE], const unsigned char* data, int size, bool pad, unsigned char* out)
{
    int written = 0;
    int padsize = size % AES_BLOCKSIZE;
    unsigned char mixed[AES_BLOCKSIZE];

    if (!data || !size || !out)
        return 0;

    if (!pad && padsize != 0)
        return 0;

    memcpy(mixed, iv, AES_BLOCKSIZE);

    // Write all but the last block
    while (written + AES_BLOCKSIZE <= size) {
        for (int i = 0; i != AES_BLOCKSIZE; i++)
            mixed[i] ^= *data++;
        enc.Encrypt(out + written, mixed);
        memcpy(mixed, out + written, AES_BLOCKSIZE);
        written += AES_BLOCKSIZE;
    }
    if (pad) {
        // For all that remains, pad each byte with the value of the remaining
        // space. If there is none, pad by a full block.
        for (int i = 0; i != padsize; i++)
            mixed[i] ^= *data++;
        for (int i = padsize; i != AES_BLOCKSIZE; i++)
            mixed[i] ^= AES_BLOCKSIZE - padsize;
        enc.Encrypt(out + written, mixed);
        written += AES_BLOCKSIZE;
    }
    return written;
}